

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O1

ValueType __thiscall
draco::PointAttribute::DeduplicateFormattedValues<int,4>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  uint *puVar1;
  uint uVar2;
  size_t __n;
  pointer pIVar3;
  size_type __new_size;
  iterator iVar4;
  ValueType VVar5;
  ulong uVar6;
  ulong uVar7;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  value_map;
  AttributeHashableValue hashable_value;
  AttributeValue att_value;
  unordered_map<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::equal_to<std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  value_to_index_map;
  vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  local_c0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  key_type local_88;
  uint local_78 [2];
  uint auStack_70 [2];
  _Hashtable<std::array<unsigned_int,_4UL>,_std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::array<unsigned_int,_4UL>_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ::vector(&local_c0,(ulong)this->num_unique_entries_,(allocator_type *)&local_a8);
  __new_size = (size_type)this->num_unique_entries_;
  if (this->num_unique_entries_ == 0) {
    VVar5 = 0;
  }
  else {
    uVar7 = 0;
    VVar5 = 0;
    do {
      puVar1 = (uint *)((in_att->buffer_->data_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start +
                       (ulong)((int)uVar7 + in_att_offset.value_) * in_att->byte_stride_ +
                       in_att->byte_offset_);
      local_88._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_88._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      local_78 = (uint  [2])local_88._M_elems._0_8_;
      auStack_70 = (uint  [2])local_88._M_elems._8_8_;
      iVar4 = std::
              _Hashtable<std::array<unsigned_int,_4UL>,_std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::array<unsigned_int,_4UL>_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_68,&local_88);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_a8 = local_88._M_elems[0];
        uStack_a4 = local_88._M_elems[1];
        uStack_a0 = local_88._M_elems[2];
        uStack_9c = local_88._M_elems[3];
        local_98 = VVar5;
        std::
        _Hashtable<std::array<unsigned_int,4ul>,std::pair<std::array<unsigned_int,4ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<std::array<unsigned_int,4ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>,std::__detail::_Select1st,std::equal_to<std::array<unsigned_int,4ul>>,draco::HashArray<std::array<unsigned_int,4ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::array<unsigned_int,4ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                  ((_Hashtable<std::array<unsigned_int,4ul>,std::pair<std::array<unsigned_int,4ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<std::array<unsigned_int,4ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>,std::__detail::_Select1st,std::equal_to<std::array<unsigned_int,4ul>>,draco::HashArray<std::array<unsigned_int,4ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68,&local_a8);
        __n = (this->super_GeometryAttribute).byte_stride_;
        memcpy((void *)(VVar5 * __n +
                       (long)(((this->super_GeometryAttribute).buffer_)->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start),local_78,__n);
        local_c0.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar7].value_ = VVar5;
        VVar5 = VVar5 + 1;
      }
      else {
        local_c0.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar7].value_ =
             *(uint *)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
                             ._M_cur + 0x18);
      }
      uVar7 = uVar7 + 1;
      __new_size = (size_type)this->num_unique_entries_;
    } while (uVar7 < __new_size);
  }
  if (VVar5 != (ValueType)__new_size) {
    if (this->identity_mapping_ == false) {
      pIVar3 = (this->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (ulong)((long)(this->indices_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) >> 2;
      if ((int)uVar7 != 0) {
        uVar6 = 0;
        do {
          pIVar3[uVar6].value_ =
               local_c0.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[pIVar3[uVar6].value_].value_;
          uVar6 = uVar6 + 1;
        } while ((uVar7 & 0xffffffff) != uVar6);
      }
    }
    else {
      this->identity_mapping_ = false;
      std::
      vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ::resize(&(this->indices_map_).vector_,__new_size,(value_type *)&kInvalidAttributeValueIndex);
      uVar2 = this->num_unique_entries_;
      if ((ulong)uVar2 != 0) {
        pIVar3 = (this->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = 0;
        do {
          pIVar3[uVar7].value_ =
               local_c0.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
    }
    this->num_unique_entries_ = VVar5;
  }
  if (local_c0.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<std::array<unsigned_int,_4UL>,_std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::array<unsigned_int,_4UL>_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return VVar5;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateFormattedValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  // We want to detect duplicates using a hash map but we cannot hash floating
  // point numbers directly so bit-copy floats to the same sized integers and
  // hash them.

  // First we need to determine which int type to use (1, 2, 4 or 8 bytes).
  // Note, this is done at compile time using std::conditional struct.
  // Conditional is in form <bool-expression, true, false>. If bool-expression
  // is true the "true" branch is used and vice versa. All at compile time.
  typedef conditional_t<sizeof(T) == 1, uint8_t,
                        conditional_t<sizeof(T) == 2, uint16_t,
                                      conditional_t<sizeof(T) == 4, uint32_t,
                                                    /*else*/ uint64_t>>>
      HashType;

  AttributeValueIndex unique_vals(0);
  typedef std::array<T, num_components_t> AttributeValue;
  typedef std::array<HashType, num_components_t> AttributeHashableValue;
  // Hash map storing index of the first attribute with a given value.
  unordered_map<AttributeHashableValue, AttributeValueIndex,
                HashArray<AttributeHashableValue>>
      value_to_index_map;
  AttributeValue att_value;
  AttributeHashableValue hashable_value;
  IndexTypeVector<AttributeValueIndex, AttributeValueIndex> value_map(
      num_unique_entries_);
  for (AttributeValueIndex i(0); i < num_unique_entries_; ++i) {
    const AttributeValueIndex att_pos = i + in_att_offset;
    att_value = in_att.GetValue<T, num_components_t>(att_pos);
    // Convert the value to hashable type. Bit-copy real attributes to integers.
    memcpy(&(hashable_value[0]), &(att_value[0]), sizeof(att_value));

    // Check if the given attribute value has been used before already.
    auto it = value_to_index_map.find(hashable_value);
    if (it != value_to_index_map.end()) {
      // Duplicated value found. Update index mapping.
      value_map[i] = it->second;
    } else {
      // New unique value.
      // Update the hash map with a new entry pointing to the latest unique
      // vertex index.
      value_to_index_map.insert(
          std::pair<AttributeHashableValue, AttributeValueIndex>(hashable_value,
                                                                 unique_vals));
      // Add the unique value to the mesh builder.
      SetAttributeValue(unique_vals, &att_value);
      // Update index mapping.
      value_map[i] = unique_vals;

      ++unique_vals;
    }
  }
  if (unique_vals == num_unique_entries_) {
    return unique_vals.value();  // Nothing has changed.
  }
  if (is_mapping_identity()) {
    // Change identity mapping to the explicit one.
    // The number of points is equal to the number of old unique values.
    SetExplicitMapping(num_unique_entries_);
    // Update the explicit map.
    for (uint32_t i = 0; i < num_unique_entries_; ++i) {
      SetPointMapEntry(PointIndex(i), value_map[AttributeValueIndex(i)]);
    }
  } else {
    // Update point to value map using the mapping between old and new values.
    for (PointIndex i(0); i < static_cast<uint32_t>(indices_map_.size()); ++i) {
      SetPointMapEntry(i, value_map[indices_map_[i]]);
    }
  }
  num_unique_entries_ = unique_vals.value();
  return num_unique_entries_;
}